

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AssbinImporter::ReadBinaryMesh(AssbinImporter *this,IOStream *stream,aiMesh *mesh)

{
  aiFace *paVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  aiColor4t<float> *out;
  aiVector3t<float> *paVar5;
  ulong *puVar6;
  aiFace *paVar7;
  uint *puVar8;
  aiBone **ppaVar9;
  aiBone *paVar10;
  runtime_error *this_00;
  uint n;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar3 = Read<unsigned_int>(stream);
  if (uVar3 != 0x1237) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Magic chunk identifiers are wrong!","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_00900168;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  Read<unsigned_int>(stream);
  uVar3 = Read<unsigned_int>(stream);
  mesh->mPrimitiveTypes = uVar3;
  uVar3 = Read<unsigned_int>(stream);
  mesh->mNumVertices = uVar3;
  uVar3 = Read<unsigned_int>(stream);
  mesh->mNumFaces = uVar3;
  uVar3 = Read<unsigned_int>(stream);
  mesh->mNumBones = uVar3;
  uVar3 = Read<unsigned_int>(stream);
  mesh->mMaterialIndex = uVar3;
  uVar3 = Read<unsigned_int>(stream);
  if ((uVar3 & 1) != 0) {
    uVar4 = mesh->mNumVertices;
    uVar13 = (ulong)uVar4;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar13 * 0xc,1);
    }
    else {
      paVar5 = (aiVector3t<float> *)operator_new__(uVar13 * 0xc);
      if (uVar4 != 0) {
        memset(paVar5,0,((uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      mesh->mVertices = paVar5;
      ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
    }
  }
  if ((uVar3 & 2) != 0) {
    uVar4 = mesh->mNumVertices;
    uVar13 = (ulong)uVar4;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar13 * 0xc,1);
    }
    else {
      paVar5 = (aiVector3t<float> *)operator_new__(uVar13 * 0xc);
      if (uVar4 != 0) {
        memset(paVar5,0,((uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      mesh->mNormals = paVar5;
      ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
    }
  }
  if ((uVar3 & 4) != 0) {
    uVar4 = mesh->mNumVertices;
    uVar13 = (ulong)uVar4;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar13 * 0xc,1);
      (*stream->_vptr_IOStream[4])(stream,(ulong)mesh->mNumVertices * 0xc,1);
    }
    else {
      paVar5 = (aiVector3t<float> *)operator_new__(uVar13 * 0xc);
      if (uVar4 != 0) {
        memset(paVar5,0,((uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      mesh->mTangents = paVar5;
      ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
      uVar4 = mesh->mNumVertices;
      paVar5 = (aiVector3t<float> *)operator_new__((ulong)uVar4 * 0xc);
      if (uVar4 != 0) {
        memset(paVar5,0,(((ulong)uVar4 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      mesh->mBitangents = paVar5;
      ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
    }
  }
  lVar11 = 0;
  do {
    if (((uVar3 >> ((byte)lVar11 & 0x1f)) >> 0x10 & 1) == 0) break;
    uVar4 = mesh->mNumVertices;
    uVar13 = (ulong)uVar4 << 4;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar13,1);
    }
    else {
      out = (aiColor4t<float> *)operator_new__(uVar13);
      if ((ulong)uVar4 != 0) {
        memset(out,0,uVar13);
      }
      mesh->mColors[lVar11] = out;
      ReadArray<aiColor4t<float>>(stream,out,uVar4);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  lVar11 = 0;
  do {
    if (((uVar3 >> ((byte)lVar11 & 0x1f)) >> 8 & 1) == 0) break;
    uVar4 = Read<unsigned_int>(stream);
    mesh->mNumUVComponents[lVar11] = uVar4;
    uVar4 = mesh->mNumVertices;
    uVar13 = (ulong)uVar4;
    if (this->shortened == true) {
      (*stream->_vptr_IOStream[4])(stream,uVar13 * 0xc,1);
    }
    else {
      paVar5 = (aiVector3t<float> *)operator_new__(uVar13 * 0xc);
      if (uVar4 != 0) {
        memset(paVar5,0,((uVar13 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      mesh->mTextureCoords[lVar11] = paVar5;
      ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  if (this->shortened == true) {
    Read<unsigned_int>(stream);
  }
  else {
    uVar13 = (ulong)mesh->mNumFaces;
    puVar6 = (ulong *)operator_new__(uVar13 * 0x10 + 8);
    paVar1 = (aiFace *)(puVar6 + 1);
    *puVar6 = uVar13;
    if (uVar13 != 0) {
      paVar7 = paVar1;
      do {
        paVar7->mNumIndices = 0;
        paVar7->mIndices = (uint *)0x0;
        paVar7 = paVar7 + 1;
      } while (paVar7 != paVar1 + uVar13);
    }
    mesh->mFaces = paVar1;
    if (mesh->mNumFaces != 0) {
      uVar13 = 0;
      do {
        paVar1 = mesh->mFaces;
        uVar2 = Read<unsigned_short>(stream);
        paVar1[uVar13].mNumIndices = (uint)uVar2;
        puVar8 = (uint *)operator_new__((ulong)uVar2 << 2);
        paVar1[uVar13].mIndices = puVar8;
        if (paVar1[uVar13].mNumIndices != 0) {
          uVar12 = 0;
          do {
            if (mesh->mNumVertices < 0x10000) {
              uVar2 = Read<unsigned_short>(stream);
              uVar3 = (uint)uVar2;
            }
            else {
              uVar3 = Read<unsigned_int>(stream);
            }
            paVar1[uVar13].mIndices[uVar12] = uVar3;
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar1[uVar13].mNumIndices);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < mesh->mNumFaces);
    }
  }
  if ((ulong)mesh->mNumBones != 0) {
    ppaVar9 = (aiBone **)operator_new__((ulong)mesh->mNumBones << 3);
    mesh->mBones = ppaVar9;
    if (mesh->mNumBones != 0) {
      uVar13 = 0;
      do {
        paVar10 = (aiBone *)operator_new(0x450);
        (paVar10->mName).length = 0;
        (paVar10->mName).data[0] = '\0';
        memset((paVar10->mName).data + 1,0x1b,0x3ff);
        paVar10->mNumWeights = 0;
        paVar10->mWeights = (aiVertexWeight *)0x0;
        (paVar10->mOffsetMatrix).a1 = 1.0;
        (paVar10->mOffsetMatrix).a2 = 0.0;
        (paVar10->mOffsetMatrix).a3 = 0.0;
        (paVar10->mOffsetMatrix).a4 = 0.0;
        (paVar10->mOffsetMatrix).b1 = 0.0;
        (paVar10->mOffsetMatrix).b2 = 1.0;
        (paVar10->mOffsetMatrix).b3 = 0.0;
        (paVar10->mOffsetMatrix).b4 = 0.0;
        (paVar10->mOffsetMatrix).c1 = 0.0;
        (paVar10->mOffsetMatrix).c2 = 0.0;
        (paVar10->mOffsetMatrix).c3 = 1.0;
        (paVar10->mOffsetMatrix).c4 = 0.0;
        (paVar10->mOffsetMatrix).d1 = 0.0;
        (paVar10->mOffsetMatrix).d2 = 0.0;
        (paVar10->mOffsetMatrix).d3 = 0.0;
        (paVar10->mOffsetMatrix).d4 = 1.0;
        mesh->mBones[uVar13] = paVar10;
        ReadBinaryBone(this,stream,mesh->mBones[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar13 < mesh->mNumBones);
    }
  }
  return;
}

Assistant:

void AssbinImporter::ReadBinaryMesh( IOStream * stream, aiMesh* mesh ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMESH)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mesh->mPrimitiveTypes = Read<unsigned int>(stream);
    mesh->mNumVertices = Read<unsigned int>(stream);
    mesh->mNumFaces = Read<unsigned int>(stream);
    mesh->mNumBones = Read<unsigned int>(stream);
    mesh->mMaterialIndex = Read<unsigned int>(stream);

    // first of all, write bits for all existent vertex components
    unsigned int c = Read<unsigned int>(stream);

    if (c & ASSBIN_MESH_HAS_POSITIONS) {
        if (shortened) {
            ReadBounds(stream,mesh->mVertices,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mVertices = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mVertices,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_NORMALS) {
        if (shortened) {
            ReadBounds(stream,mesh->mNormals,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mNormals,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS) {
        if (shortened) {
            ReadBounds(stream,mesh->mTangents,mesh->mNumVertices);
            ReadBounds(stream,mesh->mBitangents,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTangents,mesh->mNumVertices);
            mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mBitangents,mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
        if (!(c & ASSBIN_MESH_HAS_COLOR(n))) {
            break;
        }

        if (shortened) {
            ReadBounds(stream,mesh->mColors[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mColors[n] = new aiColor4D[mesh->mNumVertices];
            ReadArray<aiColor4D>(stream,mesh->mColors[n],mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
        if (!(c & ASSBIN_MESH_HAS_TEXCOORD(n))) {
            break;
        }

        // write number of UV components
        mesh->mNumUVComponents[n] = Read<unsigned int>(stream);

        if (shortened) {
            ReadBounds(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }
    }

    // write faces. There are no floating-point calculations involved
    // in these, so we can write a simple hash over the face data
    // to the dump file. We generate a single 32 Bit hash for 512 faces
    // using Assimp's standard hashing function.
    if (shortened) {
        Read<unsigned int>(stream);
    } else  {
        // else write as usual
        // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
            aiFace& f = mesh->mFaces[i];

            static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
            f.mNumIndices = Read<uint16_t>(stream);
            f.mIndices = new unsigned int[f.mNumIndices];

            for (unsigned int a = 0; a < f.mNumIndices;++a) {
                // Check if unsigned  short ( 16 bit  ) are big enought for the indices
                if ( fitsIntoUI16( mesh->mNumVertices ) ) {
                    f.mIndices[a] = Read<uint16_t>(stream);
                } else {
                    f.mIndices[a] = Read<unsigned int>(stream);
                }
            }
        }
    }

    // write bones
    if (mesh->mNumBones) {
        mesh->mBones = new C_STRUCT aiBone*[mesh->mNumBones];
        for (unsigned int a = 0; a < mesh->mNumBones;++a) {
            mesh->mBones[a] = new aiBone();
            ReadBinaryBone(stream,mesh->mBones[a]);
        }
    }
}